

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmContinue(LlvmCompilationContext *ctx,ExprContinue *node)

{
  LLVMBasicBlockRef pLVar1;
  LLVMValueRef pLVar2;
  LLVMBasicBlockRef afterReturn;
  LLVMBasicBlockRef target;
  ExprContinue *node_local;
  LlvmCompilationContext *ctx_local;
  
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  pLVar1 = GetLoopContinueBlock(ctx,*(uint *)&(node->super_ExprBase).field_0x2c);
  LLVMBuildBr(ctx->builder,pLVar1);
  pLVar1 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"after_continue");
  LLVMPositionBuilderAtEnd(ctx->builder,pLVar1);
  pLVar2 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar2;
}

Assistant:

LLVMValueRef CompileLlvmContinue(LlvmCompilationContext &ctx, ExprContinue *node)
{
	if(node->closures)
		CompileLlvm(ctx, node->closures);

	LLVMBasicBlockRef target = GetLoopContinueBlock(ctx, node->depth);

	LLVMBuildBr(ctx.builder, target);

	LLVMBasicBlockRef afterReturn = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "after_continue");

	LLVMPositionBuilderAtEnd(ctx.builder, afterReturn);

	return CheckType(ctx, node, NULL);
}